

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vgm_Emu.cpp
# Opt level: O1

blargg_err_t __thiscall Vgm_Emu::setup_fm(Vgm_Emu *this)

{
  byte *pbVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  char *pcVar5;
  blargg_err_t pcVar6;
  char *unaff_R14;
  double dVar7;
  long ym2413_rate;
  long ym2612_rate;
  ulong local_20;
  ulong local_18;
  
  pbVar1 = (this->super_Vgm_Emu_Impl).data;
  local_18 = (ulong)*(uint *)(pbVar1 + 0x2c);
  local_20 = (ulong)*(uint *)(pbVar1 + 0x10);
  if ((local_20 != 0) && (*(uint *)(pbVar1 + 8) < 0x110)) {
    Vgm_Emu_Impl::update_fm_rates(&this->super_Vgm_Emu_Impl,(long *)&local_20,(long *)&local_18);
  }
  this->uses_fm = false;
  dVar7 = (double)(this->super_Vgm_Emu_Impl).blip_buf.sample_rate_;
  this->fm_rate = dVar7 * 1.5;
  if (local_18 != 0) {
    this->uses_fm = true;
    if (this->disable_oversampling_ == true) {
      this->fm_rate = (double)(long)local_18 * 0.006944444444444444;
    }
    Fir_Resampler_::time_ratio
              (&(this->super_Vgm_Emu_Impl).super_Dual_Resampler.resampler.super_Fir_Resampler_,
               this->fm_rate / dVar7,0.99,
               (this->super_Vgm_Emu_Impl).super_Classic_Emu.super_Music_Emu.gain_ * 1.5);
    pcVar5 = Ym2612_Emu::set_rate
                       (&(this->super_Vgm_Emu_Impl).ym2612.super_Ym2612_Emu,this->fm_rate,
                        (double)(long)local_18);
    if (pcVar5 != (char *)0x0) {
      return pcVar5;
    }
    (this->super_Vgm_Emu_Impl).ym2612.last_time = 0;
    (this->super_Vgm_Emu_Impl).super_Classic_Emu.super_Music_Emu.voice_count_ = 8;
    unaff_R14 = (blargg_err_t)0x0;
  }
  if (local_20 != 0 && this->uses_fm == false) {
    this->uses_fm = true;
    if (this->disable_oversampling_ == true) {
      this->fm_rate = (double)(long)local_20 * 0.013888888888888888;
    }
    Fir_Resampler_::time_ratio
              (&(this->super_Vgm_Emu_Impl).super_Dual_Resampler.resampler.super_Fir_Resampler_,
               this->fm_rate / (double)(this->super_Vgm_Emu_Impl).blip_buf.sample_rate_,0.99,
               (this->super_Vgm_Emu_Impl).super_Classic_Emu.super_Music_Emu.gain_ * 1.5);
    iVar4 = Ym2413_Emu::set_rate
                      (&(this->super_Vgm_Emu_Impl).ym2413.super_Ym2413_Emu,this->fm_rate,
                       (double)(long)local_20);
    if (iVar4 == 0) {
      (this->super_Vgm_Emu_Impl).ym2413.last_time = 0;
      (this->super_Vgm_Emu_Impl).super_Classic_Emu.super_Music_Emu.voice_count_ = 8;
      bVar3 = true;
    }
    else {
      if (iVar4 == 2) {
        unaff_R14 = "YM2413 FM sound isn\'t supported";
      }
      else {
        unaff_R14 = "Out of memory";
      }
      bVar3 = false;
    }
    if (!bVar3) {
      return unaff_R14;
    }
  }
  if (this->uses_fm == true) {
    auVar2 = SEXT816((long)(this->super_Vgm_Emu_Impl).blip_buf.length_ *
                     (this->super_Vgm_Emu_Impl).blip_buf.sample_rate_) * SEXT816(0x20c49ba5e353f7cf)
    ;
    pcVar6 = Dual_Resampler::reset
                       (&(this->super_Vgm_Emu_Impl).super_Dual_Resampler,
                        (int)(auVar2._8_8_ >> 7) - (auVar2._12_4_ >> 0x1f));
    if (pcVar6 != (blargg_err_t)0x0) {
      return pcVar6;
    }
    dVar7 = (this->super_Vgm_Emu_Impl).super_Classic_Emu.super_Music_Emu.gain_ * 0.405;
  }
  else {
    (this->super_Vgm_Emu_Impl).ym2612.last_time = -1;
    (this->super_Vgm_Emu_Impl).ym2413.last_time = -1;
    dVar7 = (this->super_Vgm_Emu_Impl).super_Classic_Emu.super_Music_Emu.gain_;
  }
  Sms_Apu::volume(&(this->super_Vgm_Emu_Impl).psg,dVar7);
  return (blargg_err_t)0x0;
}

Assistant:

blargg_err_t Vgm_Emu::setup_fm()
{
	long ym2612_rate = get_le32( header().ym2612_rate );
	long ym2413_rate = get_le32( header().ym2413_rate );
	if ( ym2413_rate && get_le32( header().version ) < 0x110 )
		update_fm_rates( &ym2413_rate, &ym2612_rate );
	
	uses_fm = false;
	
	fm_rate = blip_buf.sample_rate() * oversample_factor;
	
	if ( ym2612_rate )
	{
		uses_fm = true;
		if ( disable_oversampling_ )
			fm_rate = ym2612_rate / 144.0;
		Dual_Resampler::setup( fm_rate / blip_buf.sample_rate(), rolloff, fm_gain * gain() );
		RETURN_ERR( ym2612.set_rate( fm_rate, ym2612_rate ) );
		ym2612.enable( true );
		set_voice_count( 8 );
	}
	
	if ( !uses_fm && ym2413_rate )
	{
		uses_fm = true;
		if ( disable_oversampling_ )
			fm_rate = ym2413_rate / 72.0;
		Dual_Resampler::setup( fm_rate / blip_buf.sample_rate(), rolloff, fm_gain * gain() );
		int result = ym2413.set_rate( fm_rate, ym2413_rate );
		if ( result == 2 )
			return "YM2413 FM sound isn't supported";
		CHECK_ALLOC( !result );
		ym2413.enable( true );
		set_voice_count( 8 );
	}
	
	if ( uses_fm )
	{
		RETURN_ERR( Dual_Resampler::reset( blip_buf.length() * blip_buf.sample_rate() / 1000 ) );
		psg.volume( 0.135 * fm_gain * gain() );
	}
	else
	{
		ym2612.enable( false );
		ym2413.enable( false );
		psg.volume( gain() );
	}
	
	return 0;
}